

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

string * __thiscall
spectest::ExpectedValueToString_abi_cxx11_
          (string *__return_storage_ptr__,spectest *this,ExpectedValue *ev)

{
  int iVar1;
  ExpectedValue *ev_00;
  char *format;
  int lane;
  int lane_00;
  ExpectedValue local_80;
  string local_50;
  
  if (*(int *)this + 4U < 2) {
    if (*(int *)(this + 0x20) == 2) {
      wabt::Type::GetName_abi_cxx11_((string *)&local_80,(Type *)this);
      format = "%s:nan:arithmetic";
    }
    else {
      if (*(int *)(this + 0x20) != 1) goto LAB_0011eb98;
      wabt::Type::GetName_abi_cxx11_((string *)&local_80,(Type *)this);
      format = "%s:nan:canonical";
    }
    wabt::StringPrintf_abi_cxx11_(__return_storage_ptr__,format,local_80.value.type);
    std::__cxx11::string::_M_dispose();
  }
  else {
    if (*(int *)this == -5) {
      iVar1 = LaneCountFromType(*(Type *)(this + 0x18));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"v128 ",(allocator<char> *)&local_80);
      for (lane_00 = 0; iVar1 != lane_00; lane_00 = lane_00 + 1) {
        GetLane(&local_80,(ExpectedValue *)this,lane_00);
        ExpectedValueToString_abi_cxx11_(&local_50,(spectest *)&local_80,ev_00);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::_M_dispose();
      }
      return __return_storage_ptr__;
    }
LAB_0011eb98:
    wabt::interp::TypedValueToString_abi_cxx11_(__return_storage_ptr__,(interp *)this,&ev->value);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ExpectedValueToString(const ExpectedValue& ev) {
  // Extend TypedValueToString to print expected nan values too.
  switch (ev.value.type) {
    case Type::F32:
    case Type::F64:
      switch (ev.nan[0]) {
        case ExpectedNan::None:
          return TypedValueToString(ev.value);

        case ExpectedNan::Arithmetic:
          return StringPrintf("%s:nan:arithmetic",
                              ev.value.type.GetName().c_str());

        case ExpectedNan::Canonical:
          return StringPrintf("%s:nan:canonical",
                              ev.value.type.GetName().c_str());
      }
      break;

    case Type::V128: {
      int lane_count = LaneCountFromType(ev.lane_type);
      std::string result = "v128 ";
      for (int lane = 0; lane < lane_count; ++lane) {
        result += ExpectedValueToString(GetLane(ev, lane));
      }
      return result;
    }

    default:
      break;
  }
  return TypedValueToString(ev.value);
}